

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecAtt.h
# Opt level: O0

void Vec_AttWriteEntry(Vec_Att_t *p,int i,void *pEntry)

{
  int local_2c;
  void *pEntry_local;
  int i_local;
  Vec_Att_t *p_local;
  
  if (p->pArrayPtr == (void **)0x0) {
    __assert_fail("p->pArrayPtr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecAtt.h"
                  ,0xe5,"void Vec_AttWriteEntry(Vec_Att_t *, int, void *)");
  }
  if (p->pFuncStartObj == (_func_void_ptr_void_ptr *)0x0) {
    if (p->nCap <= i) {
      if (i < p->nCap * 2) {
        local_2c = p->nCap << 1;
      }
      else {
        local_2c = i + 10;
      }
      Vec_AttGrow(p,local_2c);
    }
    p->pArrayPtr[i] = pEntry;
    return;
  }
  __assert_fail("p->pFuncStartObj == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecAtt.h"
                ,0xe6,"void Vec_AttWriteEntry(Vec_Att_t *, int, void *)");
}

Assistant:

static inline void Vec_AttWriteEntry( Vec_Att_t * p, int i, void * pEntry )
{
    assert( p->pArrayPtr );
    assert( p->pFuncStartObj == NULL );
    if ( i >= p->nCap )
        Vec_AttGrow( p, (2 * p->nCap > i)? 2 * p->nCap : i + 10 );
    p->pArrayPtr[i] = pEntry;
}